

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatawidgetmapper.cpp
# Opt level: O2

void __thiscall
QDataWidgetMapper::setItemDelegate(QDataWidgetMapper *this,QAbstractItemDelegate *delegate)

{
  QDataWidgetMapperPrivate *this_00;
  QAbstractItemDelegate *oldDelegate;
  long in_FS_OFFSET;
  undefined1 local_38 [16];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QDataWidgetMapperPrivate **)(this + 8);
  oldDelegate = this_00->delegate;
  QDataWidgetMapperPrivate::disconnectDelegate(this_00);
  this_00->delegate = delegate;
  if (delegate != (QAbstractItemDelegate *)0x0) {
    QObjectPrivate::
    connect<void(QAbstractItemDelegate::*)(QWidget*),void(QDataWidgetMapperPrivate::*)(QWidget*)>
              ((Object *)local_38,(offset_in_QAbstractItemDelegate_to_subr)delegate,
               (Object *)QAbstractItemDelegate::commitData,0,(ConnectionType)this_00);
    QObjectPrivate::
    connect<void(QAbstractItemDelegate::*)(QWidget*,QAbstractItemDelegate::EndEditHint),void(QDataWidgetMapperPrivate::*)(QWidget*,QAbstractItemDelegate::EndEditHint)>
              ((Object *)(local_38 + 8),(offset_in_QAbstractItemDelegate_to_subr)delegate,
               (Object *)QAbstractItemDelegate::closeEditor,0,(ConnectionType)this_00);
    std::array<QMetaObject::Connection,_2UL>::operator=
              (&this_00->delegateConnections,(array<QMetaObject::Connection,_2UL> *)local_38);
    std::array<QMetaObject::Connection,_2UL>::~array
              ((array<QMetaObject::Connection,_2UL> *)local_38);
  }
  QDataWidgetMapperPrivate::flipEventFilters(this_00,oldDelegate,delegate);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDataWidgetMapper::setItemDelegate(QAbstractItemDelegate *delegate)
{
    Q_D(QDataWidgetMapper);
    QAbstractItemDelegate *oldDelegate = d->delegate;
    d->disconnectDelegate();

    d->delegate = delegate;

    if (delegate) {
        d->delegateConnections = {
            QObjectPrivate::connect(delegate, &QAbstractItemDelegate::commitData,
                                    d, &QDataWidgetMapperPrivate::commitData),
            QObjectPrivate::connect(delegate, &QAbstractItemDelegate::closeEditor,
                                    d, &QDataWidgetMapperPrivate::closeEditor)
        };
    }

    d->flipEventFilters(oldDelegate, delegate);
}